

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# content_encoding.c
# Opt level: O2

CURLcode inflate_stream(Curl_easy *data,Curl_cwriter *writer,int type,zlibInitState started)

{
  Curl_cwriter **z;
  Curl_cwriter *zlib_init;
  int iVar1;
  Curl_cwriter *pCVar2;
  CURLcode CVar3;
  uint uVar4;
  CURLcode CVar5;
  int iVar6;
  Curl_cwtype *buf;
  bool bVar7;
  CURLcode CStack_60;
  
  z = &writer[1].next;
  zlib_init = writer + 1;
  if ((*(uint *)&writer[1].cwt < 7) && ((0x66U >> (*(uint *)&writer[1].cwt & 0x1f) & 1) != 0)) {
    iVar1 = *(int *)&writer[1].ctx;
    pCVar2 = writer[1].next;
    buf = (Curl_cwtype *)(*Curl_cmalloc)(0x4000);
    if (buf != (Curl_cwtype *)0x0) {
      CVar5 = CURLE_OK;
switchD_0011c0d5_caseD_0:
      bVar7 = false;
      goto switchD_0011c0d5_caseD_fffffffb;
    }
    CStack_60 = CURLE_OUT_OF_MEMORY;
  }
  else {
    CStack_60 = CURLE_WRITE_ERROR;
  }
  CVar5 = exit_zlib(data,(z_stream *)z,(zlibInitState *)zlib_init,CStack_60);
  return CVar5;
switchD_0011c0d5_caseD_fffffffb:
  if (bVar7) {
LAB_0011c1bf:
    (*Curl_cfree)(buf);
    if ((iVar1 != 0) && (*(int *)&zlib_init->cwt == 1)) {
      *(zlibInitState *)&zlib_init->cwt = started;
    }
    return CVar5;
  }
  writer[2].cwt = buf;
  *(undefined4 *)&writer[2].next = 0x4000;
  uVar4 = inflate(z,5);
  iVar6 = *(int *)&writer[2].next;
  CVar3 = CVar5;
  if (uVar4 < 2 && iVar6 != 0x4000) {
    *(zlibInitState *)&writer[1].cwt = started;
    CVar5 = Curl_cwriter_write(data,writer->next,type,(char *)buf,(ulong)(0x4000 - iVar6));
    CVar3 = CURLE_OK;
    if (CVar5 != CURLE_OK) {
      exit_zlib(data,(z_stream *)z,(zlibInitState *)zlib_init,CVar5);
      goto LAB_0011c1bf;
    }
  }
  CVar5 = CVar3;
  bVar7 = true;
  switch(uVar4) {
  case 0:
    goto switchD_0011c0d5_caseD_0;
  case 1:
    CVar5 = process_trailer(data,(zlib_writer *)writer);
  case 0xfffffffb:
    goto switchD_0011c0d5_caseD_fffffffb;
  default:
    process_zlib_error(data,(z_stream *)z);
    break;
  case 0xfffffffd:
    if (*(int *)&zlib_init->cwt == 1) {
      inflateEnd(z);
      iVar6 = inflateInit2_(z,0xfffffffffffffff1,"1.2.11",0x70);
      if (iVar6 == 0) {
        writer[1].next = pCVar2;
        *(int *)&writer[1].ctx = iVar1;
        writer[1].cwt = (Curl_cwtype *)0x400000002;
        goto switchD_0011c0d5_caseD_0;
      }
      *(undefined4 *)&zlib_init->cwt = 0;
    }
    process_zlib_error(data,(z_stream *)z);
  }
  CVar5 = exit_zlib(data,(z_stream *)z,(zlibInitState *)zlib_init,CURLE_BAD_CONTENT_ENCODING);
  goto switchD_0011c0d5_caseD_fffffffb;
}

Assistant:

static CURLcode inflate_stream(struct Curl_easy *data,
                               struct Curl_cwriter *writer, int type,
                               zlibInitState started)
{
  struct zlib_writer *zp = (struct zlib_writer *) writer;
  z_stream *z = &zp->z;         /* zlib state structure */
  uInt nread = z->avail_in;
  Bytef *orig_in = z->next_in;
  bool done = FALSE;
  CURLcode result = CURLE_OK;   /* Curl_client_write status */
  char *decomp;                 /* Put the decompressed data here. */

  /* Check state. */
  if(zp->zlib_init != ZLIB_INIT &&
     zp->zlib_init != ZLIB_INFLATING &&
     zp->zlib_init != ZLIB_INIT_GZIP &&
     zp->zlib_init != ZLIB_GZIP_INFLATING)
    return exit_zlib(data, z, &zp->zlib_init, CURLE_WRITE_ERROR);

  /* Dynamically allocate a buffer for decompression because it is uncommonly
     large to hold on the stack */
  decomp = malloc(DSIZ);
  if(!decomp)
    return exit_zlib(data, z, &zp->zlib_init, CURLE_OUT_OF_MEMORY);

  /* because the buffer size is fixed, iteratively decompress and transfer to
     the client via next_write function. */
  while(!done) {
    int status;                   /* zlib status */
    done = TRUE;

    /* (re)set buffer for decompressed output for every iteration */
    z->next_out = (Bytef *) decomp;
    z->avail_out = DSIZ;

#ifdef Z_BLOCK
    /* Z_BLOCK is only available in zlib ver. >= 1.2.0.5 */
    status = inflate(z, Z_BLOCK);
#else
    /* fallback for zlib ver. < 1.2.0.5 */
    status = inflate(z, Z_SYNC_FLUSH);
#endif

    /* Flush output data if some. */
    if(z->avail_out != DSIZ) {
      if(status == Z_OK || status == Z_STREAM_END) {
        zp->zlib_init = started;      /* Data started. */
        result = Curl_cwriter_write(data, writer->next, type, decomp,
                                     DSIZ - z->avail_out);
        if(result) {
          exit_zlib(data, z, &zp->zlib_init, result);
          break;
        }
      }
    }

    /* Dispatch by inflate() status. */
    switch(status) {
    case Z_OK:
      /* Always loop: there may be unflushed latched data in zlib state. */
      done = FALSE;
      break;
    case Z_BUF_ERROR:
      /* No more data to flush: just exit loop. */
      break;
    case Z_STREAM_END:
      result = process_trailer(data, zp);
      break;
    case Z_DATA_ERROR:
      /* some servers seem to not generate zlib headers, so this is an attempt
         to fix and continue anyway */
      if(zp->zlib_init == ZLIB_INIT) {
        /* Do not use inflateReset2(): only available since zlib 1.2.3.4. */
        (void) inflateEnd(z);     /* do not care about the return code */
        if(inflateInit2(z, -MAX_WBITS) == Z_OK) {
          z->next_in = orig_in;
          z->avail_in = nread;
          zp->zlib_init = ZLIB_INFLATING;
          zp->trailerlen = 4; /* Tolerate up to 4 unknown trailer bytes. */
          done = FALSE;
          break;
        }
        zp->zlib_init = ZLIB_UNINIT;    /* inflateEnd() already called. */
      }
      result = exit_zlib(data, z, &zp->zlib_init, process_zlib_error(data, z));
      break;
    default:
      result = exit_zlib(data, z, &zp->zlib_init, process_zlib_error(data, z));
      break;
    }
  }
  free(decomp);

  /* We are about to leave this call so the `nread' data bytes will not be seen
     again. If we are in a state that would wrongly allow restart in raw mode
     at the next call, assume output has already started. */
  if(nread && zp->zlib_init == ZLIB_INIT)
    zp->zlib_init = started;      /* Cannot restart anymore. */

  return result;
}